

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O3

int __thiscall
anon_unknown.dwarf_38a::NinjaMain::ToolRestat(NinjaMain *this,Options *options,int argc,char **argv)

{
  BuildLog *this_00;
  size_type sVar1;
  pointer pcVar2;
  StringPiece path;
  bool bVar3;
  int iVar4;
  LoadStatus LVar5;
  long *plVar6;
  ulong *puVar7;
  char *msg;
  long lVar8;
  string err;
  string log_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_98;
  string local_78;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  _optind = 1;
  iVar4 = getopt(argc + 1,argv + -1,"h");
  if (iVar4 != -1) {
    puts("usage: ninja -t restat [outputs]");
    return 1;
  }
  lVar8 = (long)_optind;
  bVar3 = EnsureBuildDirExists(this);
  if (!bVar3) {
    return 1;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_38 = lVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,".ninja_log","");
  sVar1 = (this->build_dir_)._M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (this->build_dir_)._M_dataplus._M_p;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>((string *)local_58,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::append((char *)local_58);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_58,(ulong)local_78._M_dataplus._M_p);
    puVar7 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_98.field_2._M_allocated_capacity = *puVar7;
      local_98.field_2._8_8_ = plVar6[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *puVar7;
      local_98._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_98._M_string_length = plVar6[1];
    *plVar6 = (long)puVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity =
       local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
  this_00 = &this->build_log_;
  LVar5 = BuildLog::Load(this_00,&local_78,&local_98);
  iVar4 = 0;
  if (LVar5 != LOAD_NOT_FOUND) {
    if (LVar5 == LOAD_ERROR) {
      Error("loading build log %s: %s",local_78._M_dataplus._M_p,local_98._M_dataplus._M_p);
      iVar4 = 1;
    }
    else {
      if (local_98._M_string_length != 0) {
        Warning("%s",local_98._M_dataplus._M_p);
        local_98._M_string_length = 0;
        *local_98._M_dataplus._M_p = '\0';
      }
      path.len_ = local_78._M_string_length;
      path.str_ = local_78._M_dataplus._M_p;
      bVar3 = BuildLog::Restat(this_00,path,&(this->disk_interface_).super_DiskInterface,
                               (argc + 1) - (int)local_38,argv + -1 + local_38,&local_98);
      if (bVar3) {
        if ((this->config_->dry_run != false) ||
           (bVar3 = BuildLog::OpenForWrite(this_00,&local_78,&this->super_BuildLogUser,&local_98),
           iVar4 = 0, bVar3)) goto LAB_00107aec;
        msg = "opening build log: %s";
      }
      else {
        msg = "failed recompaction: %s";
      }
      iVar4 = 1;
      Error(msg,local_98._M_dataplus._M_p);
    }
  }
LAB_00107aec:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return iVar4;
}

Assistant:

int NinjaMain::ToolRestat(const Options* options, int argc, char* argv[]) {
  // The restat tool uses getopt, and expects argv[0] to contain the name of the
  // tool, i.e. "restat"
  argc++;
  argv--;

  optind = 1;
  int opt;
  while ((opt = getopt(argc, argv, const_cast<char*>("h"))) != -1) {
    switch (opt) {
    case 'h':
    default:
      printf("usage: ninja -t restat [outputs]\n");
      return 1;
    }
  }
  argv += optind;
  argc -= optind;

  if (!EnsureBuildDirExists())
    return 1;

  string log_path = ".ninja_log";
  if (!build_dir_.empty())
    log_path = build_dir_ + "/" + log_path;

  string err;
  const LoadStatus status = build_log_.Load(log_path, &err);
  if (status == LOAD_ERROR) {
    Error("loading build log %s: %s", log_path.c_str(), err.c_str());
    return EXIT_FAILURE;
  }
  if (status == LOAD_NOT_FOUND) {
    // Nothing to restat, ignore this
    return EXIT_SUCCESS;
  }
  if (!err.empty()) {
    // Hack: Load() can return a warning via err by returning LOAD_SUCCESS.
    Warning("%s", err.c_str());
    err.clear();
  }

  bool success = build_log_.Restat(log_path, disk_interface_, argc, argv, &err);
  if (!success) {
    Error("failed recompaction: %s", err.c_str());
    return EXIT_FAILURE;
  }

  if (!config_.dry_run) {
    if (!build_log_.OpenForWrite(log_path, *this, &err)) {
      Error("opening build log: %s", err.c_str());
      return EXIT_FAILURE;
    }
  }

  return EXIT_SUCCESS;
}